

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

string * __thiscall
dap::
BasicTypeInfo<dap::optional<std::vector<dap::ExceptionDetails,std::allocator<dap::ExceptionDetails>>>>
::name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  BasicTypeInfo<dap::optional<std::vector<dap::ExceptionDetails,_std::allocator<dap::ExceptionDetails>_>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)((long)this + 8));
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }